

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::matrix4d>
          (GeomPrimvar *this,matrix4d *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  pointer pSVar5;
  matrix4d *pmVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined7 uVar8;
  long lVar7;
  pointer pSVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  byte bVar10;
  undefined1 local_164 [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  undefined8 local_140;
  long local_130 [15];
  undefined1 local_b8 [136];
  
  bVar10 = 0;
  if (dest == (matrix4d *)0x0) {
joined_r0x001a828b:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar3 = false;
        uVar8 = 0;
      }
      else {
        uVar4 = (*pvVar1->type_id)();
        bVar3 = uVar4 == 4;
        uVar8 = (undefined7)((ulong)in_RCX >> 8);
      }
      bVar2 = (this->_attr)._var._blocked;
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar8,bVar3 | bVar2);
      if (bVar3 != false || (bVar2 & 1) != 0) goto joined_r0x001a828b;
    }
    else {
      bVar2 = (this->_attr)._var._blocked;
    }
    if ((((bVar2 & 1) == 0) &&
        (pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
       ((uVar4 = (*pvVar1->type_id)(), uVar4 == 0 ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar4 = (*pvVar1->type_id)(), uVar4 == 1)))))) {
      pSVar9 = (this->_attr)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 = (this->_attr)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar5 != pSVar9) {
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
          pSVar9 = (this->_attr)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar5 = (this->_attr)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (pSVar5 != pSVar9) {
          pmVar6 = tinyusdz::value::Value::as<tinyusdz::value::matrix4d>(&pSVar9->value,false);
          if (pmVar6 == (matrix4d *)0x0) {
            return false;
          }
          for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
            dest->m[0][0] = pmVar6->m[0][0];
            pmVar6 = (matrix4d *)((long)pmVar6 + ((ulong)bVar10 * -2 + 1) * 8);
            dest = (matrix4d *)((long)dest + ((ulong)bVar10 * -2 + 1) * 8);
          }
          return true;
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
    }
    else {
      this_00 = &this->_attr;
      uVar4 = Attribute::type_id(this_00);
      bVar3 = IsSupportedGeomPrimvarType(uVar4);
      if (bVar3) {
        primvar::PrimVar::get_value<tinyusdz::value::matrix4d>
                  ((optional<tinyusdz::value::matrix4d> *)local_b8,&(this->_attr)._var);
        bVar3 = local_b8[0];
        if (local_b8[0] == true) {
          memcpy((void *)((long)&local_140 + 7),local_b8 + 8,0x80);
          memcpy(local_b8 + 7,(void *)((long)&local_140 + 7),0x80);
          memcpy(dest,local_b8 + 7,0x80);
          return true;
        }
        if (err == (string *)0x0) {
          return local_b8[0];
        }
        local_140 = local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   "");
        local_164._0_4_ = 0x38;
        Attribute::type_name_abi_cxx11_((string *)(local_164 + 4),this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  ((string *)local_b8,(fmt *)&local_140,(string *)local_164,(uint *)(local_164 + 4),
                   in_R8);
        std::__cxx11::string::_M_append((char *)err,CONCAT71(local_b8._1_7_,local_b8[0]));
        if ((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]) != local_b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]),local_b8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_164._4_8_ != &local_150) {
          operator_delete((void *)local_164._4_8_,local_150._M_allocated_capacity + 1);
        }
        if (local_140 == local_130) {
          return bVar3;
        }
        operator_delete(local_140,local_130[0] + 1);
        return bVar3;
      }
      if (err != (string *)0x0) {
        local_140 = local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_((string *)(local_164 + 4),this_00);
        fmt::format<std::__cxx11::string>
                  ((string *)local_b8,(fmt *)&local_140,(string *)(local_164 + 4),in_RCX);
        std::__cxx11::string::_M_append((char *)err,CONCAT71(local_b8._1_7_,local_b8[0]));
        if ((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]) != local_b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]),local_b8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_164._4_8_ != &local_150) {
          operator_delete((void *)local_164._4_8_,local_150._M_allocated_capacity + 1);
        }
        if (local_140 != local_130) {
          operator_delete(local_140,local_130[0] + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}